

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

_Bool xm_is_channel_active(xm_context_t *ctx,uint16_t chn)

{
  long lVar1;
  ushort in_SI;
  long in_RDI;
  xm_channel_context_t *ch;
  bool local_19;
  
  if ((in_SI == 0) || (*(ushort *)(in_RDI + 0xc) < in_SI)) {
    fprintf(_stderr,"%s(): invalid channel %d\n","xm_is_channel_active",(ulong)in_SI);
    fflush(_stderr);
  }
  lVar1 = *(long *)(in_RDI + 0x168) + (long)(int)(in_SI - 1) * 0x138;
  local_19 = false;
  if ((*(long *)(lVar1 + 8) != 0) && (local_19 = false, *(long *)(lVar1 + 0x10) != 0)) {
    local_19 = 0.0 <= *(float *)(lVar1 + 0x20);
  }
  return local_19;
}

Assistant:

bool xm_is_channel_active(xm_context_t* ctx, uint16_t chn) {
	CHECK_CHANNEL(ctx, chn);
	xm_channel_context_t* ch = ctx->channels + (chn - 1);
	return ch->instrument != NULL && ch->sample != NULL && ch->sample_position >= 0;
}